

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

BOOLEAN __thiscall
BVSparse<Memory::ArenaAllocator>::Test(BVSparse<Memory::ArenaAllocator> *this,BVIndex i)

{
  BVSparseNode *pBVar1;
  SparseBVUnit *pSVar2;
  Type_conflict *local_20;
  Type_conflict *prevNextField;
  
  local_20 = (Type_conflict *)0x0;
  pBVar1 = NodeFromIndex(this,i,&local_20);
  if (pBVar1 == (BVSparseNode *)0x0) {
    pSVar2 = &s_EmptyUnit;
  }
  else {
    pSVar2 = &pBVar1->data;
  }
  BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
  return (pSVar2->word >> ((ulong)i & 0x3f) & 1) != 0;
}

Assistant:

BOOLEAN
BVSparse<TAllocator>::Test(BVIndex i) const
{
    return this->BitsFromIndex(i)->Test(SparseBVUnit::Offset(i));
}